

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzip_stream.cc
# Opt level: O2

void __thiscall
google::protobuf::io::GzipInputStream::GzipInputStream
          (GzipInputStream *this,ZeroCopyInputStream *sub_stream,Format format,int buffer_size)

{
  int iVar1;
  Bytef *pBVar2;
  
  (this->super_ZeroCopyInputStream)._vptr_ZeroCopyInputStream =
       (_func_int **)&PTR__GzipInputStream_0020e8f0;
  this->format_ = format;
  this->sub_stream_ = sub_stream;
  this->zerror_ = 0;
  (this->zcontext_).next_in = (Bytef *)0x0;
  (this->zcontext_).avail_in = 0;
  (this->zcontext_).total_in = 0;
  (this->zcontext_).opaque = (voidpf)0x0;
  (this->zcontext_).total_out = 0;
  (this->zcontext_).msg = (char *)0x0;
  (this->zcontext_).zalloc = (alloc_func)0x0;
  (this->zcontext_).zfree = (free_func)0x0;
  iVar1 = 0x10000;
  if (buffer_size != -1) {
    iVar1 = buffer_size;
  }
  this->output_buffer_length_ = (long)iVar1;
  pBVar2 = (Bytef *)operator_new((long)iVar1);
  this->output_buffer_ = pBVar2;
  (this->zcontext_).next_out = pBVar2;
  (this->zcontext_).avail_out = (uInt)this->output_buffer_length_;
  this->output_position_ = pBVar2;
  return;
}

Assistant:

GzipInputStream::GzipInputStream(
    ZeroCopyInputStream* sub_stream, Format format, int buffer_size)
    : format_(format), sub_stream_(sub_stream), zerror_(Z_OK) {
  zcontext_.zalloc = Z_NULL;
  zcontext_.zfree = Z_NULL;
  zcontext_.opaque = Z_NULL;
  zcontext_.total_out = 0;
  zcontext_.next_in = NULL;
  zcontext_.avail_in = 0;
  zcontext_.total_in = 0;
  zcontext_.msg = NULL;
  if (buffer_size == -1) {
    output_buffer_length_ = kDefaultBufferSize;
  } else {
    output_buffer_length_ = buffer_size;
  }
  output_buffer_ = operator new(output_buffer_length_);
  GOOGLE_CHECK(output_buffer_ != NULL);
  zcontext_.next_out = static_cast<Bytef*>(output_buffer_);
  zcontext_.avail_out = output_buffer_length_;
  output_position_ = output_buffer_;
}